

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bluetooth_piconet.c
# Opt level: O0

void try_hop(btbb_packet *pkt,btbb_piconet *pn)

{
  uint8_t uVar1;
  int iVar2;
  uint8_t filter_uap;
  btbb_piconet *pn_local;
  btbb_packet *pkt_local;
  
  uVar1 = pn->UAP;
  btbb_decode(pkt,pn);
  iVar2 = btbb_piconet_get_flag(pn,9);
  if (iVar2 == 0) {
    iVar2 = btbb_piconet_get_flag(pn,4);
    if (iVar2 == 0) {
      iVar2 = btbb_uap_from_header(pkt,pn);
      if (iVar2 != 0) {
        if (uVar1 == pn->UAP) {
          printf("got CLK1-6\n");
          btbb_init_hop_reversal(0,pn);
          btbb_winnow(pn);
        }
        else {
          printf("failed to confirm UAP\n");
        }
      }
    }
    else {
      btbb_uap_from_header(pkt,pn);
      iVar2 = btbb_piconet_get_flag(pn,5);
      if (iVar2 != 0) {
        printf("got CLK1-27\n");
        printf("clock offset = %d.\n",(ulong)(uint)pn->clk_offset);
      }
    }
  }
  else {
    pn->pattern_indices[pn->packets_observed] = pkt->clkn - pn->first_pkt_time;
    pn->pattern_channels[pn->packets_observed] = pkt->channel;
    pn->packets_observed = pn->packets_observed + 1;
    pn->total_packets_observed = pn->total_packets_observed + 1;
    btbb_winnow(pn);
    iVar2 = btbb_piconet_get_flag(pn,5);
    if (iVar2 != 0) {
      printf("got CLK1-27\n");
      printf("clock offset = %d.\n",(ulong)(uint)pn->clk_offset);
    }
  }
  iVar2 = btbb_piconet_get_flag(pn,2);
  if (iVar2 == 0) {
    btbb_piconet_set_flag(pn,2,1);
    pn->UAP = uVar1;
  }
  return;
}

Assistant:

void try_hop(btbb_packet *pkt, btbb_piconet *pn)
{
	uint8_t filter_uap = pn->UAP;

	/* Decode packet - fixing clock drift in the process */
	btbb_decode(pkt, pn);

	if (btbb_piconet_get_flag(pn, BTBB_HOP_REVERSAL_INIT)) {
		//pn->winnowed = 0;
		pn->pattern_indices[pn->packets_observed] =
			pkt->clkn - pn->first_pkt_time;
		pn->pattern_channels[pn->packets_observed] = pkt->channel;
		pn->packets_observed++;
		pn->total_packets_observed++;
		btbb_winnow(pn);
		if (btbb_piconet_get_flag(pn, BTBB_CLK27_VALID)) {
			printf("got CLK1-27\n");
			printf("clock offset = %d.\n", pn->clk_offset);
		}
	} else {
		if (btbb_piconet_get_flag(pn, BTBB_CLK6_VALID)) {
			btbb_uap_from_header(pkt, pn);
			if (btbb_piconet_get_flag(pn, BTBB_CLK27_VALID)) {
				printf("got CLK1-27\n");
				printf("clock offset = %d.\n", pn->clk_offset);
			}
		} else {
			if (btbb_uap_from_header(pkt, pn)) {
				if (filter_uap == pn->UAP) {
					printf("got CLK1-6\n");
					btbb_init_hop_reversal(0, pn);
					btbb_winnow(pn);
				} else {
					printf("failed to confirm UAP\n");
				}
			}
		}
	}

	if(!btbb_piconet_get_flag(pn, BTBB_UAP_VALID)) {
		btbb_piconet_set_flag(pn, BTBB_UAP_VALID, 1);
		pn->UAP = filter_uap;
	}
}